

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispPrint.cpp
# Opt level: O1

shared_ptr<Form> buildList(shared_ptr<Form> *forms,int count)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Form *__tmp;
  int in_EDX;
  element_type *extraout_RDX;
  element_type *extraout_RDX_00;
  undefined4 in_register_00000034;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  shared_ptr<Form> sVar5;
  shared_ptr<Form> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  (forms->super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0015b690;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0;
  p_Var3[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[2]._M_use_count = 0;
  p_Var3[2]._M_weak_count = 0;
  p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[3]._M_use_count = 0;
  p_Var3[3]._M_weak_count = 0;
  (forms->super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var3;
  (forms->super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)(p_Var3 + 1);
  *(undefined4 *)&p_Var3[1]._vptr__Sp_counted_base = 7;
  p_Var3[2]._vptr__Sp_counted_base = *(_func_int ***)CONCAT44(in_register_00000034,count);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var3[2]._M_use_count,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((undefined8 *)CONCAT44(in_register_00000034,count) + 1));
  _Var2 = gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  peVar1 = gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (in_EDX == 1) {
    if (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (forms->super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ((element_type *)_Var4._M_pi)->pair[1].super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    this_00._M_pi =
         ((element_type *)_Var4._M_pi)->pair[1].super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    ((element_type *)_Var4._M_pi)->pair[1].super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
  }
  else {
    sVar5 = buildList(&local_38,count + 0x10);
    _Var2._M_pi = local_38.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    peVar1 = local_38.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Var4 = sVar5.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_38.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_38.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var3[3]._M_use_count;
    p_Var3[3]._vptr__Sp_counted_base = (_func_int **)peVar1;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var3[3]._M_use_count = _Var2._M_pi;
    this_00._M_pi = local_38.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
      this_00._M_pi =
           local_38.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
  }
  sVar5.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)forms;
  return (shared_ptr<Form>)sVar5.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Form> buildList(std::shared_ptr<Form>* forms, int count) {
  auto f = std::make_shared<Form>();
  f->kind = FormKind::PAIR;
  f->pair[0] = forms[0];
  if(count - 1) {
    f->pair[1] = buildList(forms + 1, count - 1);
  } else {
    f->pair[1] = gSymbolTable.getEmptyPair();
  }

  return f;
}